

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5StructureAddLevel(int *pRc,Fts5Structure **ppStruct)

{
  int iVar1;
  void *pvVar2;
  long *in_RSI;
  Fts5Structure **in_RDI;
  sqlite3_int64 nByte;
  int nLevel;
  Fts5Structure *pStruct;
  
  fts5StructureMakeWritable((int *)nByte,in_RDI);
  if (*(int *)in_RDI == 0) {
    iVar1 = *(int *)(*in_RSI + 0x1c);
    pvVar2 = sqlite3_realloc64((void *)((long)(iVar1 + 1) * 0x10 + 0x30),0x2799b7);
    if (pvVar2 == (void *)0x0) {
      *(int *)in_RDI = 7;
    }
    else {
      memset((void *)((long)pvVar2 + (long)iVar1 * 0x10 + 0x20),0,0x10);
      *(int *)((long)pvVar2 + 0x1c) = *(int *)((long)pvVar2 + 0x1c) + 1;
      *in_RSI = (long)pvVar2;
    }
  }
  return;
}

Assistant:

static void fts5StructureAddLevel(int *pRc, Fts5Structure **ppStruct){
  fts5StructureMakeWritable(pRc, ppStruct);
  assert( (ppStruct!=0 && (*ppStruct)!=0) || (*pRc)!=SQLITE_OK );
  if( *pRc==SQLITE_OK ){
    Fts5Structure *pStruct = *ppStruct;
    int nLevel = pStruct->nLevel;
    sqlite3_int64 nByte = (
        sizeof(Fts5Structure) +                  /* Main structure */
        sizeof(Fts5StructureLevel) * (nLevel+1)  /* aLevel[] array */
    );

    pStruct = sqlite3_realloc64(pStruct, nByte);
    if( pStruct ){
      memset(&pStruct->aLevel[nLevel], 0, sizeof(Fts5StructureLevel));
      pStruct->nLevel++;
      *ppStruct = pStruct;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}